

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O3

void string_hash_test(void)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  time_t tVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  char str [32];
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  iVar8 = 0;
  do {
    lVar7 = 0;
    do {
      iVar1 = rand();
      str[lVar7] = (char)(iVar1 % 0x19) + 'a';
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    str._5_4_ = str._5_4_ & 0xffffff;
    sVar5 = strlen(str);
    uVar2 = hash_djb2((uint8_t *)str,(int)sVar5);
    printf("%s %10u %5u\n",str,(ulong)uVar2,(ulong)(uVar2 & 0xfff));
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x10);
  uVar6 = 0;
  do {
    iVar8 = rand();
    sprintf(str,"asdf%d.%d",(ulong)uVar6,(long)iVar8 % 100 & 0xffffffff);
    sVar5 = strlen(str);
    uVar2 = hash_djb2((uint8_t *)str,(int)sVar5);
    printf("%s %10u %5u\n",str,(ulong)uVar2,(ulong)(uVar2 & 0x3ff));
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x10);
  builtin_strncpy(str,"1234aaaaaaaa",0xd);
  sVar5 = strlen(str);
  uVar2 = hash_djb2((uint8_t *)str,(int)sVar5);
  builtin_strncpy(str,"5678aaaaaaaa",0xd);
  sVar5 = strlen(str);
  uVar3 = hash_djb2((uint8_t *)str,(int)sVar5);
  printf("%u %u\n",(ulong)uVar2,(ulong)uVar3);
  builtin_strncpy(str,"1234aaaaaaaa",0xd);
  sVar5 = strlen(str);
  uVar2 = hash_djb2_last8((uint8_t *)str,(int)sVar5);
  builtin_strncpy(str,"5678aaaaaaaa",0xd);
  sVar5 = strlen(str);
  uVar3 = hash_djb2_last8((uint8_t *)str,(int)sVar5);
  printf("%u %u\n",(ulong)uVar2,(ulong)uVar3);
  builtin_strncpy(str,"./dummy0",9);
  sVar5 = strlen(str);
  uVar2 = hash_djb2_last8((uint8_t *)str,(int)sVar5);
  builtin_strncpy(str,"./dummy01",9);
  str._9_4_ = str._9_4_ & 0xffffff00;
  sVar5 = strlen(str);
  uVar3 = hash_djb2_last8((uint8_t *)str,(int)sVar5);
  printf("%u %u\n",(ulong)uVar2,(ulong)uVar3);
  fprintf(_stderr,"%s PASSED\n","string hash test");
  return;
}

Assistant:

void string_hash_test()
{
    TEST_INIT();

    randomize();
    unsigned a, b;
    char str[32];

    int i,j;

    for (i=0;i<16;++i){
        for (j=0;j<8;++j){
            str[j] = 'a' + random('z'-'a');
        }
        str[j] = 0;
        b = hash_djb2((uint8_t *)str, strlen(str));
        (void)b;
        DBG("%s %10u %5u\n",str, b, b&0xfff);
    }

    for (i=0;i<16;++i){
        sprintf(str, "asdf%d.%d",i,random(100));
        b = hash_djb2((uint8_t *)str, strlen(str));
        (void)b;
        DBG("%s %10u %5u\n",str, b, b&((unsigned)1023));
    }

    sprintf(str, "1234aaaaaaaa");
    a = hash_djb2((uint8_t *)str, strlen(str));
    (void)a;
    sprintf(str, "5678aaaaaaaa");
    b = hash_djb2((uint8_t *)str, strlen(str));
    (void)b;
    DBG("%u %u\n", a, b);

    sprintf(str, "1234aaaaaaaa");
    a = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)a;
    sprintf(str, "5678aaaaaaaa");
    b = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)b;
    DBG("%u %u\n", a, b);

    sprintf(str, "./dummy0");
    a = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)a;
    sprintf(str, "./dummy01");
    b = hash_djb2_last8((uint8_t *)str, strlen(str));
    (void)b;
    DBG("%u %u\n", a, b);

    TEST_RESULT("string hash test");
}